

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::BndryCondLoc::BndryCondLoc
          (BndryCondLoc *this,BoxArray *ba,DistributionMapping *dm,int ncomp)

{
  bool bVar1;
  GpuArray<amrex::MLCellLinOp::BCTL,_6U> **ppGVar2;
  uint in_ECX;
  BoxArray *in_RDI;
  MFIter mfi;
  GpuArray<amrex::MLCellLinOp::BCTL,_6U> *dp;
  MFIter *in_stack_ffffffffffffff38;
  LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*> *this_00;
  BoxArray *a_grids;
  LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
  *in_stack_ffffffffffffff60;
  LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*> *this_01;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_ffffffffffffff68;
  FabArrayBase *in_stack_ffffffffffffff70;
  MFIter *local_38;
  
  a_grids = in_RDI;
  LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
  ::LayoutData(in_stack_ffffffffffffff60,in_RDI,(DistributionMapping *)in_RDI);
  this_01 = (LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*> *)
            (a_grids[2].m_bat.m_op.m_bndryReg.m_doihi.vect + 1);
  LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>::
  LayoutData((LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>
              *)this_01,a_grids,(DistributionMapping *)in_RDI);
  LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>::LayoutData
            (this_01,a_grids,(DistributionMapping *)in_RDI);
  this_00 = (LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*> *)
            &in_RDI[7].m_simplified_list;
  FabArrayBase::local_size((FabArrayBase *)0x153123f);
  PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
  ::PODVector((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
               *)this_00,(size_type)in_stack_ffffffffffffff38);
  in_RDI[8].m_bat.m_op.m_bndryReg.m_typ.itype = in_ECX;
  local_38 = (MFIter *)
             PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
             ::data((PODVector<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>,_std::allocator<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_>_>
                     *)this_00);
  MFIter::MFIter((MFIter *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68._M_head_impl,
                 (uchar)((ulong)this_01 >> 0x38));
  while( true ) {
    bVar1 = MFIter::isValid((MFIter *)&stack0xffffffffffffff68);
    if (!bVar1) break;
    LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
    ::operator[]((LayoutData<amrex::Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>_>
                  *)this_00,in_stack_ffffffffffffff38);
    std::
    vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>::
    resize((vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
            *)this_01,(size_type)a_grids);
    LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>::
    operator[]((LayoutData<amrex::Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>_>
                *)this_00,in_stack_ffffffffffffff38);
    std::vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::resize
              ((vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *)this_01
               ,(size_type)a_grids);
    in_stack_ffffffffffffff38 = local_38;
    ppGVar2 = LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>::operator[]
                        (this_00,local_38);
    *ppGVar2 = (GpuArray<amrex::MLCellLinOp::BCTL,_6U> *)in_stack_ffffffffffffff38;
    local_38 = local_38 + (int)in_ECX;
    MFIter::operator++((MFIter *)&stack0xffffffffffffff68);
  }
  MFIter::~MFIter((MFIter *)this_00);
  return;
}

Assistant:

MLCellLinOp::BndryCondLoc::BndryCondLoc (const BoxArray& ba, const DistributionMapping& dm, int ncomp)
    : bcond(ba, dm),
      bcloc(ba, dm),
      bctl(ba, dm),
      bctl_dv(bctl.local_size()*ncomp),
      m_ncomp(ncomp)
{
    auto dp = bctl_dv.data();
    for (MFIter mfi(bcloc); mfi.isValid(); ++mfi) {
        bcond[mfi].resize(ncomp);
        bcloc[mfi].resize(ncomp);
        bctl[mfi] = dp;
        dp += ncomp;
    }
}